

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

void exp_mod_calc_first_bit_optionally_safe
               (mbedtls_mpi_uint *E,size_t E_limbs,int E_public,size_t *E_limb_index,
               size_t *E_bit_index)

{
  size_t sVar1;
  ulong *in_RCX;
  int in_EDX;
  ulong in_RSI;
  mbedtls_mpi_uint *in_R8;
  size_t E_bits;
  size_t in_stack_ffffffffffffffd0;
  
  if (in_EDX == 0x2a2a2a2a) {
    sVar1 = mbedtls_mpi_core_bitlen(in_R8,in_stack_ffffffffffffffd0);
    if (sVar1 == 0) {
      sVar1 = 1;
    }
    *in_RCX = sVar1 >> 6;
    *in_R8 = sVar1 & 0x3f;
  }
  else {
    *in_RCX = in_RSI;
    *in_R8 = 0;
  }
  return;
}

Assistant:

inline void exp_mod_calc_first_bit_optionally_safe(const mbedtls_mpi_uint *E,
                                                          size_t E_limbs,
                                                          int E_public,
                                                          size_t *E_limb_index,
                                                          size_t *E_bit_index)
{
    if (E_public == MBEDTLS_MPI_IS_PUBLIC) {
        /*
         * Skip leading zero bits.
         */
        size_t E_bits = mbedtls_mpi_core_bitlen(E, E_limbs);
        if (E_bits == 0) {
            /*
             * If E is 0 mbedtls_mpi_core_bitlen() returns 0. Even if that is the case, we will want
             * to represent it as a single 0 bit and as such the bitlength will be 1.
             */
            E_bits = 1;
        }

        *E_limb_index = E_bits / biL;
        *E_bit_index = E_bits % biL;

#if defined(MBEDTLS_TEST_HOOKS) && !defined(MBEDTLS_THREADING_C)
        mbedtls_mpi_optionally_safe_codepath = MBEDTLS_MPI_IS_PUBLIC;
#endif
    } else {
        /*
         * Here we need to be constant time with respect to E and can't do anything better than
         * start at the first allocated bit.
         */
        *E_limb_index = E_limbs;
        *E_bit_index = 0;
#if defined(MBEDTLS_TEST_HOOKS) && !defined(MBEDTLS_THREADING_C)
        // Only mark the codepath safe if there wasn't an unsafe codepath before
        if (mbedtls_mpi_optionally_safe_codepath != MBEDTLS_MPI_IS_PUBLIC) {
            mbedtls_mpi_optionally_safe_codepath = MBEDTLS_MPI_IS_SECRET;
        }
#endif
    }
}